

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall Js::PathTypeHandlerBase::DumpFixedFields(PathTypeHandlerBase *this)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  uint16 uVar4;
  TypePath *pTVar5;
  PropertyRecord *pPVar6;
  char16 *pcVar7;
  ushort local_14;
  ushort local_12;
  PropertyIndex i_1;
  PropertyIndex i;
  PathTypeHandlerBase *this_local;
  
  bVar1 = FixPropsOnPathTypes();
  if (bVar1) {
    for (local_12 = 0; uVar4 = GetPathLength(this), local_12 < uVar4; local_12 = local_12 + 1) {
      pTVar5 = GetTypePath(this);
      pPVar6 = TypePath::GetPropertyId(pTVar5,(uint)local_12);
      pcVar7 = PropertyRecord::GetBuffer(pPVar6);
      pTVar5 = GetTypePath(this);
      bVar2 = TypePath::GetMaxInitializedLength(pTVar5);
      pTVar5 = GetTypePath(this);
      uVar4 = GetPathLength(this);
      bVar1 = TypePath::GetIsFixedFieldAt(pTVar5,local_12,(uint)uVar4);
      pTVar5 = GetTypePath(this);
      uVar4 = GetPathLength(this);
      bVar3 = TypePath::GetIsUsedFixedFieldAt(pTVar5,local_12,(uint)uVar4);
      Output::Print(L" %s %d%d%d,",pcVar7,(ulong)(local_12 < bVar2),(ulong)bVar1,(ulong)bVar3);
    }
  }
  else {
    for (local_14 = 0; uVar4 = GetPathLength(this), local_14 < uVar4; local_14 = local_14 + 1) {
      pTVar5 = GetTypePath(this);
      pPVar6 = TypePath::GetPropertyId(pTVar5,(uint)local_14);
      pcVar7 = PropertyRecord::GetBuffer(pPVar6);
      Output::Print(L" %s %d%d%d,",pcVar7,1,0);
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::DumpFixedFields() const {
        if (FixPropsOnPathTypes())
        {
            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetTypePath()->GetPropertyId(i)->GetBuffer(),
                    i < this->GetTypePath()->GetMaxInitializedLength() ? 1 : 0,
                    this->GetTypePath()->GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    this->GetTypePath()->GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }
        }
        else
        {
            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetTypePath()->GetPropertyId(i)->GetBuffer(), 1, 0, 0);
            }
        }
    }